

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O1

void __thiscall
UnifiedRegex::MatchSetNode::AnnotatePass3
          (MatchSetNode *this,Compiler *compiler,CountDomain accumConsumes,
          CharSet<char16_t> *accumFollow,bool accumFollowIrrefutable,bool accumFollowEOL)

{
  undefined7 in_register_00000081;
  undefined7 in_register_00000089;
  
  (this->super_Node).followConsumes = accumConsumes;
  (this->super_Node).followSet = accumFollow;
  *(uint *)&(this->super_Node).field_0xc =
       (int)CONCAT71(in_register_00000089,accumFollowEOL) * 0x100 +
       (int)CONCAT71(in_register_00000081,accumFollowIrrefutable) * 4 |
       *(uint *)&(this->super_Node).field_0xc & 0xfffffefb;
  return;
}

Assistant:

void MatchSetNode::AnnotatePass3(Compiler& compiler, CountDomain accumConsumes, CharSet<Char>* accumFollow, bool accumFollowIrrefutable, bool accumFollowEOL)
    {
        followConsumes = accumConsumes;
        followSet = accumFollow;
        isFollowIrrefutable = accumFollowIrrefutable;
        isFollowEOL = accumFollowEOL;
    }